

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O1

void __thiscall
chrono::ChArchiveAsciiDump::out
          (ChArchiveAsciiDump *this,
          ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *bVal)

{
  ChStreamOutAscii *this_00;
  int iVar1;
  
  if (0 < *(int *)&(this->super_ChArchiveOut).field_0x104) {
    iVar1 = 0;
    do {
      chrono::ChStreamOutAscii::operator<<(this->ostream,"\t");
      iVar1 = iVar1 + 1;
    } while (iVar1 < *(int *)&(this->super_ChArchiveOut).field_0x104);
  }
  if (this->suppress_names == false) {
    this_00 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(this->ostream,*(char **)bVal)
    ;
    chrono::ChStreamOutAscii::operator<<(this_00,"\t");
  }
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\"");
  chrono::ChStreamOutAscii::operator<<(this->ostream,*(string **)(bVal + 8));
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\"\n");
  return;
}

Assistant:

virtual void out     (ChNameValue<std::string> bVal){
            indent();
            if (!suppress_names) 
                (*ostream) << bVal.name() << "\t";
            (*ostream) << "\"";
            (*ostream) << bVal.value();
            (*ostream) << "\"\n";
      }